

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTree.cpp
# Opt level: O0

PCASC_FILE_NODE __thiscall
CASC_FILE_TREE::Find(CASC_FILE_TREE *this,char *szFullPath,PDWORD PtrFileSize)

{
  bool bVar1;
  DWORD local_34;
  ULONGLONG UStack_30;
  DWORD DataId;
  ULONGLONG FileNameHash;
  PCASC_FILE_NODE pFileNode;
  PDWORD PtrFileSize_local;
  char *szFullPath_local;
  CASC_FILE_TREE *this_local;
  
  pFileNode = (PCASC_FILE_NODE)PtrFileSize;
  PtrFileSize_local = (PDWORD)szFullPath;
  szFullPath_local = (char *)this;
  UStack_30 = CalcFileNameHash(szFullPath);
  local_34 = 0xffffffff;
  FileNameHash = (ULONGLONG)Map_FindObject(this->pNameMap,&stack0xffffffffffffffd0,(PDWORD)0x0);
  if ((((void *)FileNameHash == (void *)0x0) && (this->DataIdOffset != 0)) &&
     (bVar1 = IsFileDataIdName((char *)PtrFileSize_local,&local_34), bVar1)) {
    FileNameHash = (ULONGLONG)Map_FindObject(this->pIdMap,&local_34,(PDWORD)0x0);
  }
  if ((FileNameHash != 0) && (this->FileSizeOffset != 0)) {
    GetExtras(this,(PCASC_FILE_NODE)FileNameHash,(PDWORD)0x0,(PDWORD)pFileNode,(PDWORD)0x0);
  }
  return (PCASC_FILE_NODE)FileNameHash;
}

Assistant:

PCASC_FILE_NODE CASC_FILE_TREE::Find(const char * szFullPath, PDWORD PtrFileSize)
{
    PCASC_FILE_NODE pFileNode;
    ULONGLONG FileNameHash = CalcFileNameHash(szFullPath);
    DWORD DataId = CASC_INVALID_ID;

    // Lookup the path in the name map
    pFileNode = (PCASC_FILE_NODE)Map_FindObject(pNameMap, &FileNameHash);
    if(pFileNode == NULL && DataIdOffset != 0 && IsFileDataIdName(szFullPath, DataId))
    {
        pFileNode = (PCASC_FILE_NODE)Map_FindObject(pIdMap, &DataId);
    }

    // Did we find anything?
    if(pFileNode != NULL && FileSizeOffset != 0)
    {
        GetExtras(pFileNode, NULL, PtrFileSize, NULL);
    }

    return pFileNode;
}